

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O2

bool __thiscall branch_and_reduce_algorithm::almost_dominated(branch_and_reduce_algorithm *this)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pvVar4;
  pointer piVar5;
  int *piVar6;
  int *piVar7;
  int v;
  long lVar8;
  int iVar9;
  bool bVar10;
  iterator __begin3;
  int *piVar11;
  int vtx;
  value_type_conflict1 local_3c;
  fast_set *local_38;
  
  local_38 = &this->used;
  lVar8 = 0;
  bVar10 = false;
  do {
    if (this->n <= lVar8) {
      return bVar10;
    }
    if ((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar8] < 0) {
      fast_set::clear(local_38);
      piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = (this->used).uid;
      piVar3[lVar8] = iVar1;
      pvVar4 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar5 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = *(pointer *)
                ((long)&pvVar4[lVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      piVar11 = pvVar4[lVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (piVar7 = piVar11; piVar7 != piVar6; piVar7 = piVar7 + 1) {
        if (piVar5[*piVar7] < 0) {
          piVar3[*piVar7] = iVar1;
        }
      }
      for (; piVar11 != piVar6; piVar11 = piVar11 + 1) {
        iVar1 = *piVar11;
        piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar3[iVar1] < 0) {
          local_3c = -1;
          pvVar4 = (this->adj).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar9 = 0;
          for (piVar7 = pvVar4[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar7 != *(pointer *)
                         ((long)&pvVar4[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data + 8); piVar7 = piVar7 + 1) {
            iVar2 = *piVar7;
            if ((piVar3[iVar2] < 0) &&
               ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar2] != (this->used).uid)) {
              local_3c = iVar2;
              if (0 < iVar9) goto LAB_00109f5f;
              iVar9 = iVar9 + 1;
            }
          }
          std::vector<int,_std::allocator<int>_>::push_back(&this->b_vtcs,&local_3c);
          bVar10 = true;
        }
LAB_00109f5f:
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

bool branch_and_reduce_algorithm::almost_dominated()
{
    bool found = false;
    for (int v = 0; v < n; v++)
        if (x[v] < 0)
        {
            used.clear();
            used.add(v);
            for (int u : adj[v])
                if (x[u] < 0)
                    used.add(u);
            for (int u : adj[v])
                if (x[u] < 0)
                {
                    int cnt = 0;
                    int vtx = -1;
                    for (int w : adj[u])
                    {
                        if (x[w] < 0 && !used.get(w))
                        {
                            cnt++;
                            vtx = w;
                        }
                        if (cnt >= 2)
                            goto loop;
                    }
                    found = true;
                    b_vtcs.push_back(vtx);

                loop:;
                }
        }
    return found;
}